

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  User user;
  Airport airport;
  Ticket obj3;
  Ticket obj2;
  Ticket obj1;
  Ticket obj;
  string local_3d0;
  undefined1 local_3b0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Alloc_hider local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined1 local_330 [8];
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined1 local_308 [8];
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  undefined1 local_2e0 [8];
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b8 [8];
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [8];
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [8];
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [8];
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [8];
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  Airport local_1f0;
  Ticket local_198;
  Ticket local_138;
  Ticket local_d8;
  Ticket local_78;
  
  boost::gregorian::date::date((date *)local_3b0,(year_type)0x7b7,(month_type)0x1,(day_type)0x2);
  local_218._0_4_ = local_3b0._0_4_;
  local_210._M_p = (pointer)&local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Vietnam","");
  boost::gregorian::date::date((date *)&local_d8,(year_type)0x7a3,(month_type)0x1,(day_type)0x1);
  local_240._0_4_ =
       local_d8.departing_to.first.
       super_date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
       .days_;
  local_238._M_p = (pointer)&local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Sweet home Alabama","");
  Ticket::Ticket(&local_78,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_218,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_240,500.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p != &local_228) {
    operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_p != &local_200) {
    operator_delete(local_210._M_p,local_200._M_allocated_capacity + 1);
  }
  boost::gregorian::date::date((date *)local_3b0,(year_type)0x7de,(month_type)0x3,(day_type)0xa);
  local_268._0_4_ = local_3b0._0_4_;
  local_260._M_p = (pointer)&local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Minsk","");
  boost::gregorian::date::date((date *)&local_138,(year_type)0x7de,(month_type)0x2,(day_type)0x2);
  local_290._0_4_ =
       local_138.departing_to.first.
       super_date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
       .days_;
  local_288._M_p = (pointer)&local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"London","");
  Ticket::Ticket(&local_d8,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_268,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_290,1999.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_p != &local_250) {
    operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
  }
  boost::gregorian::date::date((date *)local_3b0,(year_type)0x7de,(month_type)0x4,(day_type)0xa);
  local_2b8._0_4_ = local_3b0._0_4_;
  local_2b0._M_p = (pointer)&local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Moscow","");
  boost::gregorian::date::date((date *)&local_198,(year_type)0x7de,(month_type)0x4,(day_type)0x2);
  local_2e0._0_4_ =
       local_198.departing_to.first.
       super_date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
       .days_;
  local_2d8._M_p = (pointer)&local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Amsterdam","");
  Ticket::Ticket(&local_138,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2b8,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2e0,1999.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_p != &local_2c8) {
    operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_p != &local_2a0) {
    operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
  }
  boost::gregorian::date::date((date *)local_3b0,(year_type)0x7de,(month_type)0x5,(day_type)0xa);
  local_308._0_4_ = local_3b0._0_4_;
  local_300._M_p = (pointer)&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Minsk","");
  boost::gregorian::date::date((date *)&local_1f0,(year_type)0x7de,(month_type)0x5,(day_type)0x3);
  local_330._0_4_ = local_1f0.tickets._M_t._M_impl._0_4_;
  local_328._M_p = (pointer)&local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"London","");
  Ticket::Ticket(&local_198,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_308,
                 (pair<boost::gregorian::date,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_330,1999.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_p != &local_318) {
    operator_delete(local_328._M_p,local_318._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_p != &local_2f0) {
    operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
  }
  Airport::Airport(&local_1f0);
  local_3b0._0_8_ = local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3b0,"Sheremetyevo - A.S. Pushkin international airport","");
  Airport::set_name(&local_1f0,(string *)local_3b0);
  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  local_3b0._0_4_ = 2;
  Airport::set_runway_strips(&local_1f0,(uint *)local_3b0);
  Airport::push_ticket(&local_1f0,&local_78);
  Airport::push_ticket(&local_1f0,&local_d8);
  Airport::push_ticket(&local_1f0,&local_138);
  Airport::push_ticket(&local_1f0,&local_198);
  User::User((User *)local_3b0);
  paVar1 = &local_3d0.field_2;
  local_3d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Egor","");
  User::set_first_name((User *)local_3b0,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  local_3d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Sviridenko","");
  User::set_second_name((User *)local_3b0,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  local_3d0._M_dataplus._M_p._0_4_ = 0x13;
  User::set_age((User *)local_3b0,(int *)&local_3d0);
  local_3d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"123123123123","");
  User::set_passport_id((User *)local_3b0,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  menu(&local_1f0,(User *)local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_p != &local_348) {
    operator_delete(local_358._M_p,local_348._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_p != &local_368) {
    operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._24_8_ != &local_388) {
    operator_delete((void *)local_3b0._24_8_,local_388._M_allocated_capacity + 1);
  }
  std::__cxx11::_List_base<Ticket,_std::allocator<Ticket>_>::_M_clear
            ((_List_base<Ticket,_std::allocator<Ticket>_> *)local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.name._M_dataplus._M_p != &local_1f0.name.field_2) {
    operator_delete(local_1f0.name._M_dataplus._M_p,local_1f0.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Ticket>,_std::_Select1st<std::pair<const_unsigned_int,_Ticket>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Ticket>,_std::_Select1st<std::pair<const_unsigned_int,_Ticket>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
               *)&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.arriving_from.second._M_dataplus._M_p != &local_198.arriving_from.second.field_2)
  {
    operator_delete(local_198.arriving_from.second._M_dataplus._M_p,
                    local_198.arriving_from.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.departing_to.second._M_dataplus._M_p != &local_198.departing_to.second.field_2) {
    operator_delete(local_198.departing_to.second._M_dataplus._M_p,
                    local_198.departing_to.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.arriving_from.second._M_dataplus._M_p != &local_138.arriving_from.second.field_2)
  {
    operator_delete(local_138.arriving_from.second._M_dataplus._M_p,
                    local_138.arriving_from.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.departing_to.second._M_dataplus._M_p != &local_138.departing_to.second.field_2) {
    operator_delete(local_138.departing_to.second._M_dataplus._M_p,
                    local_138.departing_to.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.arriving_from.second._M_dataplus._M_p != &local_d8.arriving_from.second.field_2) {
    operator_delete(local_d8.arriving_from.second._M_dataplus._M_p,
                    local_d8.arriving_from.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.departing_to.second._M_dataplus._M_p != &local_d8.departing_to.second.field_2) {
    operator_delete(local_d8.departing_to.second._M_dataplus._M_p,
                    local_d8.departing_to.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.arriving_from.second._M_dataplus._M_p != &local_78.arriving_from.second.field_2) {
    operator_delete(local_78.arriving_from.second._M_dataplus._M_p,
                    local_78.arriving_from.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.departing_to.second._M_dataplus._M_p != &local_78.departing_to.second.field_2) {
    operator_delete(local_78.departing_to.second._M_dataplus._M_p,
                    local_78.departing_to.second.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{

Ticket obj({{1975, 1, 2},"Vietnam"},{{1955,1,1},"Sweet home Alabama"},500);
Ticket obj1({{2014, 3, 10},"Minsk"},{{2014,2,2},"London"},1999);

Ticket obj2({{2014, 4, 10},"Moscow"},{{2014,4,2},"Amsterdam"},1999);
Ticket obj3({{2014, 5, 10},"Minsk"},{{2014,5,3},"London"},1999);


Airport airport;
airport.set_name("Sheremetyevo - A.S. Pushkin international airport");
airport.set_runway_strips(2);
airport.push_ticket(obj);
airport.push_ticket(obj1);
airport.push_ticket(obj2);
airport.push_ticket(obj3);


User user;
user.set_first_name("Egor");
user.set_second_name("Sviridenko");
user.set_age(19);
user.set_passport_id("123123123123"); // without correct passport id(only digits) user can't buy any tickets.
menu(airport,user);


//airport.delete_ticket(1); //cancel flight for example
/*
std::cout << "Show available tickets in the airport" << std::endl;
airport.show();
std::cout << std::endl;
std::cout << std::endl;
*/

//user.set_passport_id("12344125643AFDAFDAF"); // validation works;

/*
//user.buy_tickets(airport,1);
//user.buy_tickets(airport,2);
std::cout << "Show user's personal data" << std::endl;
user.show_info();
std::cout << std::endl;

std::cout << "Find ticket with rule example"<< std::endl;
user.find_ticket(airport,"20140502","20140512","London","Minsk");
//  "20140502","20140512" - data period, in which algorithm will search available tickets with given cities.
std::cout << "____________________" << std::endl;
user.buyuser's wallet and info_tickets(airport,4);
std::cout << "Find ticket with rule example(Already bought)"<< std::endl;
std::cout << std::endl;
std::cout << "____________________"<<std::endl;
//user.find_ticket(airport,"19520105","20000302","Sweet home Alabama","Vietnam");
std::cout <<"Showing tickets that are available in airport right now" << std::endl;
airport.show();
std::cout << std::endl;
std::cout << "Show user's information and his wallet" << std::endl;
//user.show_info();
//user.cancel_flight(); TODO in future . move back from std::list ticket pair to airport

//to_file(airport,"data.data");// works exception with regex match txt file
//to_file(airport,"data.txt");
//save_users_wallet(user,"wallet.txt");
*/
}